

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void predict(int argc,char **argv)

{
  bool print_prob;
  bool bVar1;
  char cVar2;
  int32_t k;
  ostream *poVar3;
  string infile;
  FastText fasttext;
  ifstream ifs;
  
  if (argc == 4) {
    k = 1;
  }
  else {
    if (argc != 5) {
      printPredictUsage();
      goto LAB_00111bb9;
    }
    k = atoi(argv[4]);
  }
  std::__cxx11::string::string((string *)&ifs,argv[1],(allocator *)&fasttext);
  print_prob = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ifs,"predict-prob");
  std::__cxx11::string::~string((string *)&ifs);
  fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x40);
  fasttext.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  fasttext.model_.super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  fasttext.output_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  fasttext._0_32_ =
       ZEXT1632((undefined1  [16])
                fasttext.input_.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&ifs,argv[2],(allocator *)&infile);
  ::fasttext::FastText::loadModel(&fasttext,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  std::__cxx11::string::string((string *)&infile,argv[3],(allocator *)&ifs);
  bVar1 = std::operator==(&infile,"-");
  if (bVar1) {
    ::fasttext::FastText::predict(&fasttext,(istream *)&std::cin,k,print_prob);
  }
  else {
    std::ifstream::ifstream(&ifs,(string *)&infile,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Input file cannot be opened!");
      std::endl<char,std::char_traits<char>>(poVar3);
LAB_00111bb9:
      exit(1);
    }
    ::fasttext::FastText::predict(&fasttext,(istream *)&ifs,k,print_prob);
    std::ifstream::close();
    std::ifstream::~ifstream(&ifs);
  }
  exit(0);
}

Assistant:

void predict(int argc, char** argv) {
  int32_t k;
  if (argc == 4) {
    k = 1;
  } else if (argc == 5) {
    k = atoi(argv[4]);
  } else {
    printPredictUsage();
    exit(EXIT_FAILURE);
  }
  bool print_prob = std::string(argv[1]) == "predict-prob";
  FastText fasttext;
  fasttext.loadModel(std::string(argv[2]));

  std::string infile(argv[3]);
  if (infile == "-") {
    fasttext.predict(std::cin, k, print_prob);
  } else {
    std::ifstream ifs(infile);
    if (!ifs.is_open()) {
      std::cerr << "Input file cannot be opened!" << std::endl;
      exit(EXIT_FAILURE);
    }
    fasttext.predict(ifs, k, print_prob);
    ifs.close();
  }

  exit(0);
}